

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O0

lzma_ret get_thread(lzma_stream_coder_conflict1 *coder,lzma_allocator *allocator)

{
  bool bVar1;
  _Bool _Var2;
  lzma_ret lVar3;
  lzma_outbuf *plVar4;
  uint mythread_j_541;
  uint mythread_i_541;
  lzma_ret ret_;
  uint mythread_j_523;
  uint mythread_i_523;
  lzma_allocator *allocator_local;
  lzma_stream_coder_conflict1 *coder_local;
  
  _Var2 = lzma_outq_has_buf(&coder->outq);
  if (!_Var2) {
    return LZMA_OK;
  }
  bVar1 = false;
  while (!bVar1) {
    mythread_mutex_lock(&coder->mutex);
    bVar1 = false;
    while (!bVar1) {
      if (coder->threads_free != (worker_thread *)0x0) {
        coder->thr = coder->threads_free;
        coder->threads_free = coder->threads_free->next;
      }
      bVar1 = true;
    }
    bVar1 = true;
  }
  mythread_mutex_unlock(&coder->mutex);
  if (coder->thr == (worker_thread *)0x0) {
    if (coder->threads_initialized == coder->threads_max) {
      return LZMA_OK;
    }
    lVar3 = initialize_new_thread(coder,allocator);
    if (lVar3 != LZMA_OK) {
      return lVar3;
    }
  }
  bVar1 = false;
  while (!bVar1) {
    mythread_mutex_lock(&coder->thr->mutex);
    bVar1 = false;
    while (!bVar1) {
      coder->thr->state = THR_RUN;
      coder->thr->in_size = 0;
      plVar4 = lzma_outq_get_buf(&coder->outq);
      coder->thr->outbuf = plVar4;
      mythread_cond_signal(&coder->thr->cond);
      bVar1 = true;
    }
    bVar1 = true;
  }
  mythread_mutex_unlock(&coder->thr->mutex);
  return LZMA_OK;
}

Assistant:

static lzma_ret
get_thread(lzma_stream_coder *coder, const lzma_allocator *allocator)
{
	// If there are no free output subqueues, there is no
	// point to try getting a thread.
	if (!lzma_outq_has_buf(&coder->outq))
		return LZMA_OK;

	// If there is a free structure on the stack, use it.
	mythread_sync(coder->mutex) {
		if (coder->threads_free != NULL) {
			coder->thr = coder->threads_free;
			coder->threads_free = coder->threads_free->next;
		}
	}

	if (coder->thr == NULL) {
		// If there are no uninitialized structures left, return.
		if (coder->threads_initialized == coder->threads_max)
			return LZMA_OK;

		// Initialize a new thread.
		return_if_error(initialize_new_thread(coder, allocator));
	}

	// Reset the parts of the thread state that have to be done
	// in the main thread.
	mythread_sync(coder->thr->mutex) {
		coder->thr->state = THR_RUN;
		coder->thr->in_size = 0;
		coder->thr->outbuf = lzma_outq_get_buf(&coder->outq);
		mythread_cond_signal(&coder->thr->cond);
	}

	return LZMA_OK;
}